

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

int Bac_NtkDfsUserBoxes_rec(Bac_Ntk_t *p,int iObj,Vec_Int_t *vBoxes)

{
  bool bVar1;
  int iVar2;
  int local_30;
  int local_2c;
  int iFanin;
  int k;
  Vec_Int_t *vBoxes_local;
  int iObj_local;
  Bac_Ntk_t *p_local;
  
  iVar2 = Bac_ObjIsBoxUser(p,iObj);
  if (iVar2 == 0) {
    __assert_fail("Bac_ObjIsBoxUser(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacNtk.c"
                  ,0x1e4,"int Bac_NtkDfsUserBoxes_rec(Bac_Ntk_t *, int, Vec_Int_t *)");
  }
  iVar2 = Bac_ObjCopy(p,iObj);
  if (iVar2 == 1) {
    p_local._4_4_ = 1;
  }
  else {
    iVar2 = Bac_ObjCopy(p,iObj);
    if (iVar2 != 0) {
      Bac_ObjSetCopy(p,iObj,0);
      local_2c = 0;
      while( true ) {
        bVar1 = false;
        if (-1 < (iObj + -1) - local_2c) {
          iVar2 = Bac_ObjIsBi(p,(iObj + -1) - local_2c);
          bVar1 = false;
          if (iVar2 != 0) {
            local_30 = Bac_BoxFanin(p,iObj,local_2c);
            bVar1 = true;
          }
        }
        if (!bVar1) break;
        iVar2 = Bac_ObjIsBo(p,local_30);
        if (iVar2 != 0) {
          iVar2 = Bac_ObjFanin(p,local_30);
          iVar2 = Bac_ObjIsBoxUser(p,iVar2);
          if (iVar2 != 0) {
            iVar2 = Bac_ObjFanin(p,local_30);
            iVar2 = Bac_NtkDfsUserBoxes_rec(p,iVar2,vBoxes);
            if (iVar2 == 0) {
              return 0;
            }
          }
        }
        local_2c = local_2c + 1;
      }
      Vec_IntPush(vBoxes,iObj);
      Bac_ObjSetCopy(p,iObj,1);
      return 1;
    }
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Bac_NtkDfsUserBoxes_rec( Bac_Ntk_t * p, int iObj, Vec_Int_t * vBoxes )
{
    int k, iFanin;
    assert( Bac_ObjIsBoxUser(p, iObj) );
    if ( Bac_ObjCopy(p, iObj) == 1 ) // visited
        return 1;
    if ( Bac_ObjCopy(p, iObj) == 0 ) // loop
        return 0;
    Bac_ObjSetCopy( p, iObj, 0 );
    Bac_BoxForEachFanin( p, iObj, iFanin, k )
        if ( Bac_ObjIsBo(p, iFanin) && Bac_ObjIsBoxUser(p, Bac_ObjFanin(p, iFanin)) )
            if ( !Bac_NtkDfsUserBoxes_rec( p, Bac_ObjFanin(p, iFanin), vBoxes ) )
                return 0;
    Vec_IntPush( vBoxes, iObj );
    Bac_ObjSetCopy( p, iObj, 1 );
    return 1;
}